

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_ManFindNtk(Au_Man_t *p,char *pName)

{
  int iVar1;
  undefined8 *puVar2;
  int i;
  
  i = 1;
  while( true ) {
    if ((p->vNtks).nSize <= i) {
      return -1;
    }
    puVar2 = (undefined8 *)Vec_PtrEntry(&p->vNtks,i);
    iVar1 = strcmp((char *)*puVar2,pName);
    if (iVar1 == 0) break;
    i = i + 1;
  }
  return i;
}

Assistant:

int Au_ManFindNtk( Au_Man_t * p, char * pName )
{
    Au_Ntk_t * pNtk;
    int i;
    Au_ManForEachNtk( p, pNtk, i )
        if ( !strcmp(Au_NtkName(pNtk), pName) )
            return i;
    return -1;
}